

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

void __thiscall glslang::TQualifier::clearLayout(TQualifier *this)

{
  this->field_0xf = this->field_0xf & 0x1f;
  this->field_0x10 = this->field_0x10 & 0xf0;
  this->layoutOffset = -1;
  this->layoutAlign = -1;
  this->layoutPushConstant = false;
  this->layoutBufferReference = false;
  this->layoutPassthrough = false;
  this->layoutViewportRelative = false;
  this->layoutSecondaryViewportRelativeOffset = -0x800;
  this->layoutShaderRecord = false;
  this->layoutFullQuads = false;
  this->layoutQuadDeriv = false;
  this->layoutHitObjectShaderRecordNV = false;
  this->layoutBindlessSampler = false;
  this->layoutBindlessImage = false;
  this->field_0x2c = 0;
  *(ulong *)&this->field_0x1c = *(ulong *)&this->field_0x1c & 0xffffffdf8000 | 0xffffffff001fcfff;
  *(ulong *)&this->field_0x24 = *(ulong *)&this->field_0x24 | 0x1ffffff7fffffff;
  return;
}

Assistant:

void clearUniformLayout() // only uniform specific
    {
        layoutMatrix = ElmNone;
        layoutPacking = ElpNone;
        layoutOffset = layoutNotSet;
        layoutAlign = layoutNotSet;

        layoutSet = layoutSetEnd;
        layoutBinding = layoutBindingEnd;
        layoutAttachment = layoutAttachmentEnd;
    }